

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

bool CheckShader(GLuint handle,char *desc)

{
  undefined8 uVar1;
  uint uVar2;
  char *pcVar3;
  undefined8 in_RSI;
  uint in_EDI;
  ImVector<char> buf;
  GLint log_length;
  GLint status;
  ImGui_ImplOpenGL3_Data *bd;
  int in_stack_ffffffffffffff8c;
  ImVector<char> *in_stack_ffffffffffffff90;
  FILE *__stream;
  ImVector<char> local_30;
  uint local_20;
  uint local_1c;
  ImGui_ImplOpenGL3_Data *local_18;
  undefined8 local_10;
  uint local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  local_18 = ImGui_ImplOpenGL3_GetBackendData();
  local_1c = 0;
  local_20 = 0;
  (*imgl3wProcs.ptr[0x24])((ulong)local_4,0x8b81,&local_1c);
  (*imgl3wProcs.ptr[0x24])((ulong)local_4,0x8b84,&local_20);
  if ((local_1c & 0xff) == 0) {
    fprintf(_stderr,
            "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s! With GLSL: %s\n",
            local_10,local_18->GlslVersionString);
  }
  if (1 < (int)local_20) {
    ImVector<char>::ImVector(&local_30);
    ImVector<char>::resize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    uVar2 = local_20;
    uVar1 = imgl3wProcs.ptr[0x23];
    pcVar3 = ImVector<char>::begin(&local_30);
    (*(code *)uVar1)((ulong)local_4,(ulong)uVar2,0,pcVar3);
    __stream = _stderr;
    pcVar3 = ImVector<char>::begin(&local_30);
    fprintf(__stream,"%s\n",pcVar3);
    ImVector<char>::~ImVector((ImVector<char> *)__stream);
  }
  return (local_1c & 0xff) == 1;
}

Assistant:

static bool CheckShader(GLuint handle, const char* desc)
{
    ImGui_ImplOpenGL3_Data* bd = ImGui_ImplOpenGL3_GetBackendData();
    GLint status = 0, log_length = 0;
    glGetShaderiv(handle, GL_COMPILE_STATUS, &status);
    glGetShaderiv(handle, GL_INFO_LOG_LENGTH, &log_length);
    if ((GLboolean)status == GL_FALSE)
        fprintf(stderr, "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s! With GLSL: %s\n", desc, bd->GlslVersionString);
    if (log_length > 1)
    {
        ImVector<char> buf;
        buf.resize((int)(log_length + 1));
        glGetShaderInfoLog(handle, log_length, NULL, (GLchar*)buf.begin());
        fprintf(stderr, "%s\n", buf.begin());
    }
    return (GLboolean)status == GL_TRUE;
}